

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O0

void __thiscall CTransaction::CTransaction(CTransaction *this,CMutableTransaction *tx)

{
  long lVar1;
  bool bVar2;
  bool *pbVar3;
  long in_RSI;
  CTransaction *in_RDI;
  long in_FS_OFFSET;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_ffffffffffffffa8;
  CTransaction *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::vector
            (in_stack_ffffffffffffffa8,(vector<CTxIn,_std::allocator<CTxIn>_> *)0x8a6b5c);
  this_00 = (CTransaction *)&in_RDI->vout;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffffa8,
             (vector<CTxOut,_std::allocator<CTxOut>_> *)0x8a6b78);
  in_RDI->version = *(uint32_t *)(in_RSI + 0x30);
  in_RDI->nLockTime = *(uint32_t *)(in_RSI + 0x34);
  pbVar3 = &in_RDI->m_has_witness;
  bVar2 = ComputeHasWitness(in_RDI);
  *pbVar3 = bVar2;
  ComputeHash(in_RDI);
  ComputeWitnessHash(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CTransaction::CTransaction(CMutableTransaction&& tx) : vin(std::move(tx.vin)), vout(std::move(tx.vout)), version{tx.version}, nLockTime{tx.nLockTime}, m_has_witness{ComputeHasWitness()}, hash{ComputeHash()}, m_witness_hash{ComputeWitnessHash()} {}